

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

bool SaveDeviceMemory(path *fname,size_t start,size_t length)

{
  bool bVar1;
  FILE *__stream;
  string local_48;
  
  __stream = (FILE *)SJ_fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_48,fname);
    Error("opening file for write",local_48._M_dataplus._M_p,FATAL);
    std::__cxx11::string::~string((string *)&local_48);
  }
  bVar1 = SaveDeviceMemory((FILE *)__stream,start,length);
  fclose(__stream);
  return bVar1;
}

Assistant:

bool SaveDeviceMemory(const std::filesystem::path & fname, const size_t start, const size_t length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	bool res = SaveDeviceMemory(ff, start, length);
	fclose(ff);
	return res;
}